

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tests-records_stop_times.c
# Opt level: O1

void CGTFS_RecordStopTime(void)

{
  int iVar1;
  long lVar2;
  undefined8 *puVar3;
  undefined **ppuVar4;
  stop_time_t *psVar5;
  byte bVar6;
  stop_time_t a;
  char *field_values [10];
  char *field_names [10];
  stop_time_t sStack_2f8;
  stop_time_t local_208;
  stop_time_t local_118;
  
  bVar6 = 0;
  iVar1 = greatest_test_pre("stop_time_read");
  if (iVar1 != 0) {
    iVar1 = _setjmp((__jmp_buf_tag *)greatest_info.jump_dest);
    if (iVar1 == 0) {
      puVar3 = &DAT_00234100;
      psVar5 = &local_118;
      for (lVar2 = 10; lVar2 != 0; lVar2 = lVar2 + -1) {
        *(char **)psVar5->trip_id = (char *)*puVar3;
        puVar3 = puVar3 + (ulong)bVar6 * -2 + 1;
        psVar5 = (stop_time_t *)((long)psVar5 + ((ulong)bVar6 * -2 + 1) * 8);
      }
      ppuVar4 = &PTR_anon_var_dwarf_2c28_00234150;
      psVar5 = &local_208;
      for (lVar2 = 10; lVar2 != 0; lVar2 = lVar2 + -1) {
        *(undefined **)psVar5->trip_id = *ppuVar4;
        ppuVar4 = ppuVar4 + (ulong)bVar6 * -2 + 1;
        psVar5 = (stop_time_t *)((long)psVar5 + ((ulong)bVar6 * -2 + 1) * 8);
      }
      read_stop_time(&sStack_2f8,10,(char **)&local_118,(char **)&local_208);
      greatest_info.assertions = greatest_info.assertions + 1;
      iVar1 = greatest_do_assert_equal_t("AWE1",&sStack_2f8,&greatest_type_info_string,(void *)0x0);
      if (iVar1 == 0) {
        greatest_info.fail_line = 0x16;
        if (greatest_type_info_string.equal == (greatest_equal_cb *)0x0) {
LAB_00122f35:
          greatest_info.msg = "type_info->equal callback missing!";
        }
        else {
          greatest_info.msg = "\"AWE1\" != st_1.trip_id";
        }
      }
      else {
        greatest_info.assertions = greatest_info.assertions + 1;
        iVar1 = greatest_do_assert_equal_t
                          ("00:06:00",sStack_2f8.arrival_time,&greatest_type_info_string,(void *)0x0
                          );
        if (iVar1 == 0) {
          greatest_info.fail_line = 0x17;
          if (greatest_type_info_string.equal == (greatest_equal_cb *)0x0) goto LAB_00122f35;
          greatest_info.msg = "\"00:06:00\" != st_1.arrival_time";
        }
        else {
          greatest_info.assertions = greatest_info.assertions + 1;
          iVar1 = greatest_do_assert_equal_t
                            ("00:06:30",sStack_2f8.departure_time,&greatest_type_info_string,
                             (void *)0x0);
          if (iVar1 == 0) {
            greatest_info.fail_line = 0x18;
            if (greatest_type_info_string.equal == (greatest_equal_cb *)0x0) goto LAB_00122f35;
            greatest_info.msg = "\"00:06:30\" != st_1.departure_time";
          }
          else {
            greatest_info.assertions = greatest_info.assertions + 1;
            iVar1 = greatest_do_assert_equal_t
                              ("ST_666",sStack_2f8.stop_id,&greatest_type_info_string,(void *)0x0);
            if (iVar1 == 0) {
              greatest_info.fail_line = 0x19;
              if (greatest_type_info_string.equal == (greatest_equal_cb *)0x0) goto LAB_00122f35;
              greatest_info.msg = "\"ST_666\" != st_1.stop_id";
            }
            else {
              greatest_info.assertions = greatest_info.assertions + 1;
              iVar1 = greatest_do_assert_equal_t
                                ("Argent D\'Nur",sStack_2f8.stop_headsign,&greatest_type_info_string
                                 ,(void *)0x0);
              if (iVar1 == 0) {
                greatest_info.fail_line = 0x1a;
                if (greatest_type_info_string.equal == (greatest_equal_cb *)0x0) goto LAB_00122f35;
                greatest_info.msg = "\"Argent D\'Nur\" != st_1.stop_headsign";
              }
              else if (sStack_2f8.stop_sequence == 1) {
                if (sStack_2f8.pickup_type == ST_NOT_AVAILABLE) {
                  if (sStack_2f8.dropoff_type == ST_CONTACT_AGENCY) {
                    if ((sStack_2f8.shape_dist_traveled != 6.8315) ||
                       (NAN(sStack_2f8.shape_dist_traveled))) {
                      greatest_info.fail_line = 0x1e;
                      greatest_info.msg = "6.8315 != st_1.shape_dist_traveled";
                      greatest_info.assertions = greatest_info.assertions + 4;
                    }
                    else {
                      greatest_info.assertions = greatest_info.assertions + 5;
                      if (sStack_2f8.timepoint == TP_EXACT) {
                        greatest_info.msg = (char *)0x0;
                        iVar1 = 0;
                        goto LAB_00122f57;
                      }
                      greatest_info.fail_line = 0x1f;
                      greatest_info.msg = "TP_EXACT != st_1.timepoint";
                    }
                  }
                  else {
                    greatest_info.fail_line = 0x1d;
                    greatest_info.msg = "ST_CONTACT_AGENCY != st_1.dropoff_type";
                    greatest_info.assertions = greatest_info.assertions + 3;
                  }
                }
                else {
                  greatest_info.fail_line = 0x1c;
                  greatest_info.msg = "ST_NOT_AVAILABLE != st_1.pickup_type";
                  greatest_info.assertions = greatest_info.assertions + 2;
                }
              }
              else {
                greatest_info.fail_line = 0x1b;
                greatest_info.msg = "1 != st_1.stop_sequence";
                greatest_info.assertions = greatest_info.assertions + 1;
              }
            }
          }
        }
      }
      greatest_info.fail_file =
           "/workspace/llm4binary/github/license_all_cmakelists_1510/4rterius[P]cgtfs/tests/tests_records/tests-records_stop_times.c"
      ;
      iVar1 = -1;
      if ((greatest_info.flags & 4) != 0) goto LAB_00123174;
    }
LAB_00122f57:
    greatest_test_post(iVar1);
  }
  iVar1 = greatest_test_pre("stop_time_compare");
  if (iVar1 == 0) {
    return;
  }
  iVar1 = _setjmp((__jmp_buf_tag *)greatest_info.jump_dest);
  if (iVar1 == 0) {
    memcpy(&sStack_2f8,"trip 0",0xf0);
    memcpy(&local_118,"trip 0",0xf0);
    memcpy(&local_208,"trip 1",0xf0);
    greatest_info.assertions = greatest_info.assertions + 1;
    iVar1 = equal_stop_time(&sStack_2f8,&local_118);
    if (iVar1 == 1) {
      greatest_info.assertions = greatest_info.assertions + 1;
      iVar1 = equal_stop_time(&sStack_2f8,&local_208);
      if (iVar1 == 0) {
        greatest_info.assertions = greatest_info.assertions + 1;
        iVar1 = equal_stop_time(&local_118,&local_208);
        if (iVar1 == 0) {
          greatest_info.msg = (char *)0x0;
          iVar1 = 0;
          goto LAB_0012305c;
        }
        greatest_info.fail_line = 0x4e;
        greatest_info.msg = "0 != equal_stop_time(&b, &c)";
      }
      else {
        greatest_info.fail_line = 0x4d;
        greatest_info.msg = "0 != equal_stop_time(&a, &c)";
      }
    }
    else {
      greatest_info.fail_line = 0x4c;
      greatest_info.msg = "1 != equal_stop_time(&a, &b)";
    }
    greatest_info.fail_file =
         "/workspace/llm4binary/github/license_all_cmakelists_1510/4rterius[P]cgtfs/tests/tests_records/tests-records_stop_times.c"
    ;
    iVar1 = -1;
    if ((greatest_info.flags & 4) != 0) {
LAB_00123174:
      greatest_info.fail_file =
           "/workspace/llm4binary/github/license_all_cmakelists_1510/4rterius[P]cgtfs/tests/tests_records/tests-records_stop_times.c"
      ;
      abort();
    }
  }
LAB_0012305c:
  greatest_test_post(iVar1);
  return;
}

Assistant:

SUITE(CGTFS_RecordStopTime) {
    RUN_TEST(stop_time_read);
    RUN_TEST(stop_time_compare);
}